

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                  *this,parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>
                        *container,MatchResultListener *listener)

{
  pointer pMVar1;
  bool bVar2;
  pointer pcVar3;
  unique_ptr<int,_std::default_delete<int>_> *value;
  size_t sVar4;
  size_t irhs;
  long lVar5;
  long lVar6;
  size_t num_elements;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  vector<char,_std::allocator<char>_> did_match;
  MatchMatrix matrix;
  string local_c8;
  const_iterator local_a8;
  DummyMatchResultListener dummy;
  const_iterator local_68;
  
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  ::begin(&local_a8,
          &container->
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         );
  local_68.iter_.it_.ctrl_ = (ctrl_t *)0x0;
  local_68.iter_.inner_ = (Inner *)0x0;
  local_68.iter_.inner_end_ = (Inner *)0x0;
  local_68.iter_.it_end_.ctrl_ = (ctrl_t *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&element_printouts);
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dummy.super_MatchResultListener.stream_ = (ostream *)0x0;
  dummy.super_MatchResultListener._vptr_MatchResultListener =
       (_func_int **)&PTR__MatchResultListener_00231b30;
  num_elements = 0;
  while( true ) {
    bVar2 = phmap::priv::operator!=(&local_a8,&local_68);
    if (!bVar2) break;
    if (listener->stream_ != (ostream *)0x0) {
      PrintToString<std::unique_ptr<int,std::default_delete<int>>>
                (&local_c8,(testing *)local_a8.iter_.it_.field_1.slot_,value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &element_printouts,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    lVar6 = 0;
    for (lVar5 = 0;
        pMVar1 = (this->matchers_).
                 super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar5 != ((long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x18;
        lVar5 = lVar5 + 1) {
      local_c8._M_dataplus._M_p._0_1_ =
           MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>::MatchAndExplain
                     ((MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)
                      ((long)&(pMVar1->
                              super_MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>
                              ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                      lVar6),local_a8.iter_.it_.field_1.slot_,&dummy.super_MatchResultListener);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&did_match,(char *)&local_c8);
      lVar6 = lVar6 + 0x18;
    }
    num_elements = num_elements + 1;
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ::const_iterator::operator++(&local_a8);
  }
  MatchMatrix::MatchMatrix
            (&matrix,num_elements,
             ((long)(this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->matchers_).
                   super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pcVar3 = did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  for (sVar4 = 0; sVar4 != num_elements; sVar4 = sVar4 + 1) {
    for (lVar5 = 0;
        lVar5 != ((long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->matchers_).
                       super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18; lVar5 = lVar5 + 1) {
      matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5 + matrix.num_matchers_ * sVar4] = pcVar3[lVar5] != '\0'
      ;
    }
    pcVar3 = pcVar3 + lVar5;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&did_match.super__Vector_base<char,_std::allocator<char>_>);
  bVar2 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,&element_printouts,&matrix,
                     listener);
  if (bVar2) {
    bVar2 = UnorderedElementsAreMatcherImplBase::FindPairing
                      (&this->super_UnorderedElementsAreMatcherImplBase,&matrix,listener);
  }
  else {
    bVar2 = false;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&element_printouts);
  return bVar2;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }